

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQFunctionProto::~SQFunctionProto(SQFunctionProto *this)

{
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQFunctionProto_00158578;
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  SQCollectable::~SQCollectable((SQCollectable *)0x12b214);
  return;
}

Assistant:

SQFunctionProto::~SQFunctionProto()
{
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}